

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_kv_cursor_data(unqlite_kv_cursor *pCursor,void *pBuf,unqlite_int64 *pnByte)

{
  int iVar1;
  SyBlob sBlob;
  SyMemBackend *local_38;
  void *local_30;
  uint local_28;
  int local_24;
  uint local_20;
  
  if (pBuf != (void *)0x0) {
    if (*pnByte < 0) {
      iVar1 = -0x18;
    }
    else {
      local_24 = (int)*pnByte;
      local_28 = 0;
      local_38 = (SyMemBackend *)0x0;
      local_20 = 3;
      local_30 = pBuf;
      iVar1 = (*pCursor->pStore->pIo->pMethods->xData)(pCursor,unqliteDataConsumer,&local_38);
      *pnByte = (ulong)local_28;
      if (((local_20 & 6) == 0) && (local_24 != 0)) {
        SyMemBackendFree(local_38,local_30);
      }
    }
    return iVar1;
  }
  iVar1 = (*pCursor->pStore->pIo->pMethods->xDataLength)(pCursor,pnByte);
  return iVar1;
}

Assistant:

int unqlite_kv_cursor_data(unqlite_kv_cursor *pCursor,void *pBuf,unqlite_int64 *pnByte)
{
	int rc;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	if( pBuf == 0 ){
		/* Data length only */
		rc = pCursor->pStore->pIo->pMethods->xDataLength(pCursor,pnByte);
	}else{
		SyBlob sBlob;
		if( (*pnByte) < 0 ){
			return UNQLITE_CORRUPT;
		}
		/* Initialize the data consumer */
		SyBlobInitFromBuf(&sBlob,pBuf,(sxu32)(*pnByte));
		/* Consume the data */
		rc = pCursor->pStore->pIo->pMethods->xData(pCursor,unqliteDataConsumer,&sBlob);
		/* Data length */
		*pnByte = SyBlobLength(&sBlob);
		/* Cleanup */
		SyBlobRelease(&sBlob);
	}
	return rc;
}